

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

bool QMetaType::
     registerMutableViewImpl<QMap<QString,QMap<QString,QVariant>>,QIterable<QMetaAssociation>>
               (MutableViewFunction view,QMetaType fromType,QMetaType toType)

{
  char cVar1;
  int iVar2;
  QMetaType in_RDX;
  
  cVar1 = QMetaType::registerMutableViewFunction((function *)fromType.d_ptr,toType,in_RDX);
  if ((cVar1 != '\0') &&
     (registerMutableViewImpl<QMap<QString,QMap<QString,QVariant>>,QIterable<QMetaAssociation>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
      ::unregister == '\0')) {
    iVar2 = __cxa_guard_acquire(&registerMutableViewImpl<QMap<QString,QMap<QString,QVariant>>,QIterable<QMetaAssociation>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
                                 ::unregister);
    if (iVar2 != 0) {
      registerMutableViewImpl<QMap<QString,_QMap<QString,_QVariant>_>,_QIterable<QMetaAssociation>_>
      ::unregister.m_invoke = true;
      registerMutableViewImpl<QMap<QString,_QMap<QString,_QVariant>_>,_QIterable<QMetaAssociation>_>
      ::unregister.m_func.fromType.d_ptr = toType.d_ptr;
      registerMutableViewImpl<QMap<QString,_QMap<QString,_QVariant>_>,_QIterable<QMetaAssociation>_>
      ::unregister.m_func.toType.d_ptr = in_RDX.d_ptr;
      __cxa_atexit(QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:688:56)>
                   ::~QScopeGuard,
                   &registerMutableViewImpl<QMap<QString,_QMap<QString,_QVariant>_>,_QIterable<QMetaAssociation>_>
                    ::unregister,&__dso_handle);
      __cxa_guard_release(&registerMutableViewImpl<QMap<QString,QMap<QString,QVariant>>,QIterable<QMetaAssociation>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
                           ::unregister);
    }
  }
  return (bool)cVar1;
}

Assistant:

static bool registerMutableViewImpl(MutableViewFunction view, QMetaType fromType, QMetaType toType)
    {
        if (registerMutableViewFunction(std::move(view), fromType, toType)) {
            static const auto unregister = qScopeGuard([=] {
               unregisterMutableViewFunction(fromType, toType);
            });
            return true;
        } else {
            return false;
        }
    }